

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

Expression * __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::removeAt
          (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this,size_t index)

{
  ulong uVar1;
  Expression *pEVar2;
  ulong uVar3;
  
  uVar1 = this->usedElements;
  if (index < uVar1) {
    pEVar2 = this->data[index];
    if (index < uVar1 - 1) {
      uVar3 = index + 1;
      do {
        this->data[uVar3 - 1] = this->data[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    resize(this,uVar1 - 1);
    return pEVar2;
  }
  __assert_fail("index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                ,0x17a,
                "T ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::removeAt(size_t) [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
               );
}

Assistant:

T removeAt(size_t index) {
    assert(index < size());
    auto item = data[index];
    for (auto i = index; i < size() - 1; ++i) {
      data[i] = data[i + 1];
    }
    resize(size() - 1);
    return item;
  }